

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O2

sexp_conflict
sexp_make_flonum_stub
          (sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,sexp_conflict arg1)

{
  int __exponent;
  sexp_conflict psVar1;
  undefined8 uStack_10;
  
  if ((((ulong)arg0 & 3) != 0) || (arg0->tag != 0xb)) {
    uStack_10 = 0xb;
    arg1 = arg0;
LAB_0010316f:
    psVar1 = (sexp_conflict)sexp_type_exception(ctx,self,uStack_10,arg1);
    return psVar1;
  }
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) != 0) || (arg1->tag != 0xc)) {
      uStack_10 = 2;
      goto LAB_0010316f;
    }
    __exponent = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
  }
  else {
    __exponent = (int)((long)arg1 >> 1);
  }
  ldexp((arg0->value).flonum,__exponent);
  psVar1 = (sexp_conflict)sexp_make_flonum(ctx);
  return psVar1;
}

Assistant:

sexp sexp_make_flonum_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  sexp res;
  if (! sexp_flonump(arg0))
    return sexp_type_exception(ctx, self, SEXP_FLONUM, arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  res = sexp_make_flonum(ctx, ldexp(sexp_flonum_value(arg0), sexp_sint_value(arg1)));
  return res;
}